

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

int __thiscall cppcms::crypto::hmac::init(hmac *this,EVP_PKEY_CTX *ctx)

{
  byte *pbVar1;
  message_digest *pmVar2;
  pointer puVar3;
  uint i;
  uint uVar4;
  int extraout_EAX;
  ulong uVar5;
  size_t __n;
  ulong __n_00;
  char *__src;
  pointer __src_00;
  void *__dest;
  vector<unsigned_char,_std::allocator<unsigned_char>_> opad;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ipad;
  allocator_type local_5a;
  allocator_type local_59;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  uVar4 = (*((this->md_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl)->
            _vptr_message_digest[3])();
  __n_00 = (ulong)uVar4;
  local_58._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,__n_00,
             (value_type_conflict3 *)&local_58,&local_5a);
  local_5a = (allocator_type)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,__n_00,
             (value_type_conflict3 *)&local_5a,&local_59);
  __src = (this->key_).data_;
  uVar5 = (this->key_).size_;
  if (__src == (char *)0x0) {
    __src = "";
  }
  if (__n_00 < uVar5) {
    (*((this->md_)._M_t.
       super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
       ._M_t.
       super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
       .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl)->
      _vptr_message_digest[4])();
    pmVar2 = (this->md_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
    (*pmVar2->_vptr_message_digest[5])(pmVar2,local_40._M_impl.super__Vector_impl_data._M_start);
    __src_00 = local_40._M_impl.super__Vector_impl_data._M_start;
    __dest = (void *)CONCAT71(local_58._M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_58._M_impl.super__Vector_impl_data._M_start._0_1_);
    uVar4 = (*((this->md_)._M_t.
               super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
               ._M_t.
               super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
               .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl)->
              _vptr_message_digest[2])();
    __n = (size_t)uVar4;
  }
  else {
    memcpy(local_40._M_impl.super__Vector_impl_data._M_start,__src,uVar5);
    __dest = (void *)CONCAT71(local_58._M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_58._M_impl.super__Vector_impl_data._M_start._0_1_);
    puVar3 = (pointer)(this->key_).data_;
    __n = (this->key_).size_;
    __src_00 = "";
    if (puVar3 != (pointer)0x0) {
      __src_00 = puVar3;
    }
  }
  memcpy(__dest,__src_00,__n);
  for (uVar5 = 0; __n_00 != uVar5; uVar5 = uVar5 + 1) {
    local_40._M_impl.super__Vector_impl_data._M_start[uVar5] =
         local_40._M_impl.super__Vector_impl_data._M_start[uVar5] ^ 0x36;
    pbVar1 = (byte *)(CONCAT71(local_58._M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_58._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar5);
    *pbVar1 = *pbVar1 ^ 0x5c;
  }
  pmVar2 = (this->md_opad_)._M_t.
           super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
           .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
  (*pmVar2->_vptr_message_digest[4])
            (pmVar2,CONCAT71(local_58._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_58._M_impl.super__Vector_impl_data._M_start._0_1_),__n_00);
  pmVar2 = (this->md_)._M_t.
           super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
           .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
  (*pmVar2->_vptr_message_digest[4])
            (pmVar2,local_40._M_impl.super__Vector_impl_data._M_start,__n_00);
  local_5a = (allocator_type)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,__n_00,
             (value_type_conflict3 *)&local_5a);
  local_5a = (allocator_type)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,__n_00,
             (value_type_conflict3 *)&local_5a);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return extraout_EAX;
}

Assistant:

void hmac::init()
	{
		unsigned const block_size = md_->block_size();
		std::vector<unsigned char> ipad(block_size,0);
		std::vector<unsigned char> opad(block_size,0);
		if(key_.size() > block_size) {
			md_->append(key_.data(),key_.size());
			md_->readout(&ipad.front());
			memcpy(&opad.front(),&ipad.front(),md_->digest_size());
		}
		else {
			memcpy(&ipad.front(),key_.data(),key_.size());
			memcpy(&opad.front(),key_.data(),key_.size());
		}
		for(unsigned i=0;i<block_size;i++) {
			ipad[i]^=0x36 ;
			opad[i]^=0x5c ;
		}
		md_opad_->append(&opad.front(),block_size);
		md_->append(&ipad.front(),block_size);
		ipad.assign(block_size,0);
		opad.assign(block_size,0);
	}